

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_getVariant_63(char *localeID,char *variant,int32_t variantCapacity,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  char **local_f8;
  char *cntryID;
  char *scriptID;
  char **ppcStack_e0;
  int32_t i;
  char *tmpLocaleID;
  char tempBuffer [157];
  UErrorCode *err_local;
  int32_t variantCapacity_local;
  char *variant_local;
  char *localeID_local;
  
  scriptID._4_4_ = 0;
  if ((err == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*err), UVar1 != '\0')) {
    localeID_local._4_4_ = 0;
  }
  else {
    if ((localeID == (char *)0x0) ||
       ((pcVar3 = strstr(localeID,"@"), pcVar3 != (char *)0x0 ||
        (iVar2 = getShortestSubtagLength(localeID), iVar2 != 1)))) {
      variant_local = localeID;
      if (localeID == (char *)0x0) {
        variant_local = uloc_getDefault_63();
      }
      ppcStack_e0 = (char **)variant_local;
    }
    else {
      iVar2 = uloc_forLanguageTag_63(localeID,(char *)&tmpLocaleID,0x9d,(int32_t *)0x0,err);
      if (((iVar2 < 1) || (UVar1 = U_FAILURE(*err), UVar1 != '\0')) ||
         (*err == U_STRING_NOT_TERMINATED_WARNING)) {
        ppcStack_e0 = (char **)localeID;
        if (*err == U_STRING_NOT_TERMINATED_WARNING) {
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
      }
      else {
        ppcStack_e0 = &tmpLocaleID;
      }
    }
    ulocimp_getLanguage_63((char *)ppcStack_e0,(char *)0x0,0,(char **)&stack0xffffffffffffff20);
    if ((*(char *)ppcStack_e0 == '_') || (*(char *)ppcStack_e0 == '-')) {
      ulocimp_getScript_63((char *)((long)ppcStack_e0 + 1),(char *)0x0,0,&cntryID);
      if (cntryID != (char *)((long)ppcStack_e0 + 1)) {
        ppcStack_e0 = (char **)cntryID;
      }
      if ((*(char *)ppcStack_e0 == '_') || (*(char *)ppcStack_e0 == '-')) {
        ulocimp_getCountry_63((char *)((long)ppcStack_e0 + 1),(char *)0x0,0,(char **)&local_f8);
        if (local_f8 != (char **)((long)ppcStack_e0 + 1)) {
          ppcStack_e0 = local_f8;
        }
        if ((*(char *)ppcStack_e0 == '_') || (*(char *)ppcStack_e0 == '-')) {
          if ((ppcStack_e0 != local_f8) &&
             ((*(char *)((long)ppcStack_e0 + 1) == '_' || (*(char *)((long)ppcStack_e0 + 1) == '-'))
             )) {
            ppcStack_e0 = (char **)((long)ppcStack_e0 + 1);
          }
          scriptID._4_4_ =
               _getVariant((char *)((long)ppcStack_e0 + 1),*(char *)ppcStack_e0,variant,
                           variantCapacity);
        }
      }
    }
    localeID_local._4_4_ = u_terminateChars_63(variant,variantCapacity,scriptID._4_4_,err);
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uloc_getVariant(const char* localeID,
                char* variant,
                int32_t variantCapacity,
                UErrorCode* err)
{
    char tempBuffer[ULOC_FULLNAME_CAPACITY];
    const char* tmpLocaleID;
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if (_hasBCP47Extension(localeID)) {
        _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), err);
    } else {
        if (localeID==NULL) {
           localeID=uloc_getDefault();
        }
        tmpLocaleID=localeID;
    }

    /* Skip the language */
    ulocimp_getLanguage(tmpLocaleID, NULL, 0, &tmpLocaleID);
    if(_isIDSeparator(*tmpLocaleID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(tmpLocaleID+1, NULL, 0, &scriptID);
        if(scriptID != tmpLocaleID+1) {
            /* Found optional script */
            tmpLocaleID = scriptID;
        }
        /* Skip the Country */
        if (_isIDSeparator(*tmpLocaleID)) {
            const char *cntryID;
            ulocimp_getCountry(tmpLocaleID+1, NULL, 0, &cntryID);
            if (cntryID != tmpLocaleID+1) {
                /* Found optional country */
                tmpLocaleID = cntryID;
            }
            if(_isIDSeparator(*tmpLocaleID)) {
                /* If there was no country ID, skip a possible extra IDSeparator */
                if (tmpLocaleID != cntryID && _isIDSeparator(tmpLocaleID[1])) {
                    tmpLocaleID++;
                }
                i=_getVariant(tmpLocaleID+1, *tmpLocaleID, variant, variantCapacity);
            }
        }
    }

    /* removed by weiv. We don't want to handle POSIX variants anymore. Use canonicalization function */
    /* if we do not have a variant tag yet then try a POSIX variant after '@' */
/*
    if(!haveVariant && (localeID=uprv_strrchr(localeID, '@'))!=NULL) {
        i=_getVariant(localeID+1, '@', variant, variantCapacity);
    }
*/
    return u_terminateChars(variant, variantCapacity, i, err);
}